

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2pointutil.cc
# Opt level: O1

bool S2::ApproxEquals(S2Point *a,S2Point *b,S1Angle max_error)

{
  double *pdVar1;
  double dVar2;
  long lVar3;
  double *ap_1;
  double *ap;
  bool bVar4;
  double adStack_60 [3];
  S1Angle local_48;
  S2LogMessage local_40;
  S2LogMessage local_30;
  
  adStack_60[2] = max_error.radians_;
  adStack_60[0] = 0.0;
  adStack_60[1] = 0.0;
  if ((a->c_[0] != 0.0) || (NAN(a->c_[0]))) {
    bVar4 = true;
  }
  else {
    lVar3 = 0;
    do {
      bVar4 = lVar3 == 0x10;
      if (bVar4) goto LAB_002098af;
      dVar2 = *(double *)((long)a->c_ + lVar3 + 8);
      pdVar1 = (double *)((long)adStack_60 + lVar3);
      lVar3 = lVar3 + 8;
    } while ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1)));
    bVar4 = false;
LAB_002098af:
    bVar4 = (bool)(bVar4 ^ 1);
  }
  if (bVar4) {
    adStack_60[0] = 0.0;
    adStack_60[1] = 0.0;
    if ((b->c_[0] != 0.0) || (NAN(b->c_[0]))) {
      bVar4 = true;
    }
    else {
      lVar3 = 0;
      do {
        bVar4 = lVar3 == 0x10;
        if (bVar4) goto LAB_00209901;
        dVar2 = *(double *)((long)b->c_ + lVar3 + 8);
        pdVar1 = (double *)((long)adStack_60 + lVar3);
        lVar3 = lVar3 + 8;
      } while ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1)));
      bVar4 = false;
LAB_00209901:
      bVar4 = (bool)(bVar4 ^ 1);
    }
    if (bVar4) {
      adStack_60[1] = 0.0;
      adStack_60[0] = 0.0;
      S1Angle::S1Angle(&local_48,a,b);
      return local_48.radians_ <= adStack_60[2];
    }
    S2LogMessage::S2LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2pointutil.cc"
               ,0x27,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_40.stream_,"Check failed: (b) != (S2Point()) ",0x21);
  }
  else {
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2pointutil.cc"
               ,0x26,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_30.stream_,"Check failed: (a) != (S2Point()) ",0x21);
  }
  abort();
}

Assistant:

bool ApproxEquals(const S2Point& a, const S2Point& b, S1Angle max_error) {
  S2_DCHECK_NE(a, S2Point());
  S2_DCHECK_NE(b, S2Point());
  return S1Angle(a, b) <= max_error;
}